

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O2

Status __thiscall spvtools::opt::IfConversion::Process(IfConversion *this)

{
  Module *pMVar1;
  __uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
  f;
  BasicBlock *block;
  Instruction *insert_before;
  pointer ppIVar2;
  bool bVar3;
  FeatureManager *pFVar4;
  DominatorAnalysis *dominators;
  pointer puVar5;
  Instruction **ppIVar6;
  Status SVar7;
  pointer puVar8;
  pointer puVar9;
  pointer ppIVar10;
  bool modified;
  pointer local_b8;
  pointer local_b0;
  IfConversion *local_a8;
  ValueNumberTable *local_a0;
  pointer local_98;
  BasicBlock *common;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> to_kill;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  InstructionBuilder builder;
  
  pFVar4 = IRContext::get_feature_mgr((this->super_Pass).context_);
  bVar3 = EnumSet<spv::Capability>::contains(&pFVar4->capabilities_,Shader);
  if (bVar3) {
    local_a0 = IRContext::GetValueNumberTable((this->super_Pass).context_);
    modified = false;
    to_kill.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    to_kill.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    to_kill.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    local_b8 = *(pointer *)
                ((long)&(pMVar1->functions_).
                        super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                + 8);
    puVar5 = *(pointer *)
              &(pMVar1->functions_).
               super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
               ._M_impl;
    local_a8 = this;
    while (ppIVar2 = to_kill.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
          ppIVar10 = to_kill.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_start, puVar5 != local_b8) {
      f.
      super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
      _M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
      .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
           (puVar5->_M_t).
           super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
      ;
      local_b0 = puVar5;
      dominators = IRContext::GetDominatorAnalysis
                             ((this->super_Pass).context_,
                              (Function *)
                              f.
                              super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                              .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl)
      ;
      puVar9 = *(pointer *)
                ((long)f.
                       super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                       .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl + 0xa0)
      ;
      local_98 = puVar9;
      for (puVar8 = *(pointer *)
                     &(((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                         *)((long)f.
                                  super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                                  .super__Head_base<0UL,_spvtools::opt::Function_*,_false>.
                                  _M_head_impl + 0x98))->
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      )._M_impl; puVar8 != puVar9; puVar8 = puVar8 + 1) {
        block = (puVar8->_M_t).
                super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        common = (BasicBlock *)0x0;
        bVar3 = CheckBlock(this,block,dominators,&common);
        if (bVar3) {
          ppIVar6 = (Instruction **)
                    ((long)&(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                            sentinel_ + 8);
          while ((insert_before = *ppIVar6,
                 insert_before !=
                 &(block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_ &&
                 (insert_before->opcode_ == OpPhi))) {
            ppIVar6 = &(insert_before->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                       next_node_;
          }
          InstructionBuilder::InstructionBuilder
                    (&builder,(this->super_Pass).context_,insert_before,
                     kAnalysisInstrToBlockMapping|kAnalysisBegin);
          local_70._8_8_ = 0;
          local_70._M_unused._M_object = operator_new(0x40);
          *(IfConversion **)local_70._M_unused._0_8_ = this;
          *(InstructionBuilder **)((long)local_70._M_unused._0_8_ + 8) = &builder;
          *(bool **)((long)local_70._M_unused._0_8_ + 0x10) = &modified;
          *(BasicBlock ***)((long)local_70._M_unused._0_8_ + 0x18) = &common;
          *(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> **)
           ((long)local_70._M_unused._0_8_ + 0x20) = &to_kill;
          *(DominatorAnalysis **)((long)local_70._M_unused._0_8_ + 0x28) = dominators;
          *(BasicBlock **)((long)local_70._M_unused._0_8_ + 0x30) = block;
          *(ValueNumberTable **)((long)local_70._M_unused._0_8_ + 0x38) = local_a0;
          local_58 = std::
                     _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp:50:28)>
                     ::_M_invoke;
          local_60 = std::
                     _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp:50:28)>
                     ::_M_manager;
          BasicBlock::ForEachPhiInst
                    (block,(function<void_(spvtools::opt::Instruction_*)> *)&local_70,false);
          this = local_a8;
          puVar9 = local_98;
          if (local_60 != (code *)0x0) {
            (*local_60)(&local_70,&local_70,__destroy_functor);
            this = local_a8;
            puVar9 = local_98;
          }
        }
      }
      puVar5 = local_b0 + 1;
    }
    for (; ppIVar10 != ppIVar2; ppIVar10 = ppIVar10 + 1) {
      IRContext::KillInst((this->super_Pass).context_,*ppIVar10);
    }
    SVar7 = modified ^ SuccessWithoutChange;
    std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~_Vector_base(&to_kill.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 );
  }
  else {
    SVar7 = SuccessWithoutChange;
  }
  return SVar7;
}

Assistant:

Pass::Status IfConversion::Process() {
  if (!context()->get_feature_mgr()->HasCapability(spv::Capability::Shader)) {
    return Status::SuccessWithoutChange;
  }

  const ValueNumberTable& vn_table = *context()->GetValueNumberTable();
  bool modified = false;
  std::vector<Instruction*> to_kill;
  for (auto& func : *get_module()) {
    DominatorAnalysis* dominators = context()->GetDominatorAnalysis(&func);
    for (auto& block : func) {
      // Check if it is possible for |block| to have phis that can be
      // transformed.
      BasicBlock* common = nullptr;
      if (!CheckBlock(&block, dominators, &common)) continue;

      // Get an insertion point.
      auto iter = block.begin();
      while (iter != block.end() && iter->opcode() == spv::Op::OpPhi) {
        ++iter;
      }

      InstructionBuilder builder(
          context(), &*iter,
          IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
      block.ForEachPhiInst([this, &builder, &modified, &common, &to_kill,
                            dominators, &block, &vn_table](Instruction* phi) {
        // This phi is not compatible, but subsequent phis might be.
        if (!CheckType(phi->type_id())) return;

        // We cannot transform cases where the phi is used by another phi in the
        // same block due to instruction ordering restrictions.
        // TODO(alan-baker): If all inappropriate uses could also be
        // transformed, we could still remove this phi.
        if (!CheckPhiUsers(phi, &block)) return;

        // Identify the incoming values associated with the true and false
        // branches. If |then_block| dominates |inc0| or if the true edge
        // branches straight to this block and |common| is |inc0|, then |inc0|
        // is on the true branch. Otherwise the |inc1| is on the true branch.
        BasicBlock* inc0 = GetIncomingBlock(phi, 0u);
        Instruction* branch = common->terminator();
        uint32_t condition = branch->GetSingleWordInOperand(0u);
        BasicBlock* then_block = GetBlock(branch->GetSingleWordInOperand(1u));
        Instruction* true_value = nullptr;
        Instruction* false_value = nullptr;
        if ((then_block == &block && inc0 == common) ||
            dominators->Dominates(then_block, inc0)) {
          true_value = GetIncomingValue(phi, 0u);
          false_value = GetIncomingValue(phi, 1u);
        } else {
          true_value = GetIncomingValue(phi, 1u);
          false_value = GetIncomingValue(phi, 0u);
        }

        BasicBlock* true_def_block = context()->get_instr_block(true_value);
        BasicBlock* false_def_block = context()->get_instr_block(false_value);

        uint32_t true_vn = vn_table.GetValueNumber(true_value);
        uint32_t false_vn = vn_table.GetValueNumber(false_value);
        if (true_vn != 0 && true_vn == false_vn) {
          Instruction* inst_to_use = nullptr;

          // Try to pick an instruction that is not in a side node.  If we can't
          // pick either the true for false branch as long as they can be
          // legally moved.
          if (!true_def_block ||
              dominators->Dominates(true_def_block, &block)) {
            inst_to_use = true_value;
          } else if (!false_def_block ||
                     dominators->Dominates(false_def_block, &block)) {
            inst_to_use = false_value;
          } else if (CanHoistInstruction(true_value, common, dominators)) {
            inst_to_use = true_value;
          } else if (CanHoistInstruction(false_value, common, dominators)) {
            inst_to_use = false_value;
          }

          if (inst_to_use != nullptr) {
            modified = true;
            HoistInstruction(inst_to_use, common, dominators);
            context()->KillNamesAndDecorates(phi);
            context()->ReplaceAllUsesWith(phi->result_id(),
                                          inst_to_use->result_id());
          }
          return;
        }

        // If either incoming value is defined in a block that does not dominate
        // this phi, then we cannot eliminate the phi with a select.
        // TODO(alan-baker): Perform code motion where it makes sense to enable
        // the transform in this case.
        if (true_def_block && !dominators->Dominates(true_def_block, &block))
          return;

        if (false_def_block && !dominators->Dominates(false_def_block, &block))
          return;

        analysis::Type* data_ty =
            context()->get_type_mgr()->GetType(true_value->type_id());
        if (analysis::Vector* vec_data_ty = data_ty->AsVector()) {
          condition = SplatCondition(vec_data_ty, condition, &builder);
        }

        Instruction* select = builder.AddSelect(phi->type_id(), condition,
                                                true_value->result_id(),
                                                false_value->result_id());
        context()->get_def_use_mgr()->AnalyzeInstDefUse(select);
        select->UpdateDebugInfoFrom(phi);
        context()->ReplaceAllUsesWith(phi->result_id(), select->result_id());
        to_kill.push_back(phi);
        modified = true;

        return;
      });
    }
  }

  for (auto inst : to_kill) {
    context()->KillInst(inst);
  }

  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}